

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::eval_divide_knuth
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,
          uintwide_t<256U,_unsigned_short,_void,_true> *other,
          uintwide_t<256U,_unsigned_short,_void,_true> *remainder)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int_fast8_t iVar4;
  unsigned_fast_type uVar5;
  long lVar6;
  unsigned_fast_type u_offset;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar5 = 0;
  for (lVar6 = 0x20;
      (u_offset = 0x10, lVar6 != 0 &&
      (u_offset = uVar5,
      *(short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar6 + -2) == 0));
      lVar6 = lVar6 + -2) {
    uVar5 = uVar5 + 1;
  }
  lVar6 = 0x20;
  uVar5 = 0;
  do {
    if (lVar6 == 0) {
LAB_00123676:
      limits_helper_max<true>();
      *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_38;
      *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_30;
      *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_48;
      *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_40;
      if (remainder != (uintwide_t<256U,_unsigned_short,_void,_true> *)0x0) {
        for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 2) {
          *(undefined2 *)((long)(remainder->values).super_array<unsigned_short,_16UL>.elems + lVar6)
               = 0;
        }
      }
      return;
    }
    if (*(short *)((long)(other->values).super_array<unsigned_short,_16UL>.elems + lVar6 + -2) != 0)
    {
      if (lVar6 != 0) {
        if (u_offset != 0x10) {
          iVar4 = compare<true,_nullptr>(this,other);
          if (iVar4 != '\0') {
            if (iVar4 == -1) {
              if (remainder != (uintwide_t<256U,_unsigned_short,_void,_true> *)0x0) {
                uVar1 = *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems;
                uVar2 = *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4);
                uVar3 = *(undefined8 *)
                         ((this->values).super_array<unsigned_short,_16UL>.elems + 0xc);
                *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 8) =
                     *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8);
                *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 0xc) =
                     uVar3;
                *(undefined8 *)(remainder->values).super_array<unsigned_short,_16UL>.elems = uVar1;
                *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 4) =
                     uVar2;
              }
              uintwide_t<256u,unsigned_short,void,true>::uintwide_t<unsigned_char>(unsigned_char,std
              ::enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
              value)&&(std::numeric_limits<unsigned_char>::digits<=std::
              numeric_limits<unsigned_short>::digits),void>::type__
                        (&local_48,'\0',
                         (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                          *)0x0);
              *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_38
              ;
              *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) =
                   uStack_30;
              *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_48;
              *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) =
                   uStack_40;
              return;
            }
            void_math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::
            eval_divide_knuth_core<256u>(unsigned_long,unsigned_long,math::wide_integer::
            uintwide_t<256u,unsigned_short,void,true>const&,math::wide_integer::
            uintwide_t<256u,unsigned_short,void,true>*,std::
            enable_if<((256u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
            digits))),int>::type__
                      (this,u_offset,uVar5,other,remainder,
                       (enable_if_t<(256U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                        *)0x0);
            return;
          }
          uintwide_t<256u,unsigned_short,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
          digits),void>::type__
                    (&local_48,'\x01',
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_38;
          *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_30;
          *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_48;
          *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_40;
        }
        if (remainder == (uintwide_t<256U,_unsigned_short,_void,_true> *)0x0) {
          return;
        }
        uintwide_t<256u,unsigned_short,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
        digits),void>::type__
                  (&local_48,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 8) = local_38;
        *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 0xc) =
             uStack_30;
        *(undefined8 *)(remainder->values).super_array<unsigned_short,_16UL>.elems = local_48;
        *(undefined8 *)((remainder->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_40
        ;
        return;
      }
      goto LAB_00123676;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + -2;
  } while( true );
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }